

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int ncnn::binary_op_broadcast_outer<ncnn::binary_op_sub>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  int *piVar1;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float fVar2;
  int x_1;
  float *ptr1_1;
  int y1;
  int y_1;
  int z1;
  int z;
  float *outptr_1;
  float *ptr_1;
  int q;
  int x;
  float *outptr;
  float *ptr1;
  float *ptr;
  int y;
  int channels;
  int d;
  int h;
  int w;
  binary_op_sub op;
  Mat *m;
  Mat *m_1;
  int local_354;
  undefined8 local_350;
  undefined8 local_348;
  undefined8 local_340;
  undefined4 local_338;
  long local_330;
  undefined4 local_328;
  undefined4 local_324;
  undefined4 local_320;
  undefined4 local_31c;
  undefined4 local_318;
  undefined8 local_310;
  long local_308;
  int local_300;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  int local_2f0;
  int local_2ec;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined4 local_2d0;
  long local_2c8;
  undefined4 local_2c0;
  undefined4 local_2bc;
  undefined4 local_2b8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined8 local_2a8;
  long local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined4 local_280;
  long local_278;
  undefined4 local_270;
  undefined4 local_26c;
  undefined4 local_268;
  undefined4 local_264;
  undefined4 local_260;
  undefined8 local_258;
  long local_250;
  int local_248;
  int local_244;
  long local_240;
  long local_238;
  long local_230;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  int local_218;
  binary_op_sub local_211 [9];
  long *local_208;
  long *local_200;
  long *local_1f8;
  undefined1 local_1ed;
  int local_1ec;
  undefined8 *local_1e0;
  undefined8 *local_1d8;
  long *local_1d0;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined1 local_1a5;
  int local_1a4;
  undefined8 *local_198;
  undefined8 *local_188;
  long local_180;
  undefined4 local_174;
  long local_170;
  long local_168;
  undefined4 local_15c;
  int local_158;
  int local_154;
  undefined8 *local_150;
  long local_148;
  undefined4 local_13c;
  long local_138;
  long local_130;
  undefined4 local_124;
  int local_120;
  int local_11c;
  undefined8 *local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  long local_f8;
  undefined8 *local_d8;
  undefined8 *local_c8;
  undefined8 *local_b8;
  int local_74;
  undefined8 *local_70;
  int local_64;
  long *local_60;
  int local_54;
  long *local_50;
  int local_44;
  undefined8 *local_38;
  long local_30;
  undefined4 local_24;
  long local_20;
  long local_18;
  undefined4 local_10;
  int local_c;
  undefined8 *local_8;
  
  local_218 = *(int *)((long)in_RDI + 0x2c);
  local_21c = (int)in_RDI[6];
  local_220 = *(int *)((long)in_RDI + 0x34);
  local_224 = (int)in_RDI[7];
  local_208 = in_RDX;
  local_200 = in_RSI;
  local_1f8 = in_RDI;
  if ((int)in_RDI[5] == 2) {
    for (local_228 = 0; local_228 < local_21c; local_228 = local_228 + 1) {
      local_60 = local_1f8;
      local_64 = local_228;
      local_230 = *local_1f8 +
                  (long)*(int *)((long)local_1f8 + 0x2c) * (long)local_228 * local_1f8[2];
      local_1d0 = local_200;
      local_238 = *local_200;
      local_50 = local_208;
      local_54 = local_228;
      local_240 = *local_208 +
                  (long)*(int *)((long)local_208 + 0x2c) * (long)local_228 * local_208[2];
      for (local_244 = 0; local_244 < local_218; local_244 = local_244 + 1) {
        fVar2 = binary_op_sub::operator()
                          (local_211,(float *)(local_230 + (long)local_244 * 4),
                           (float *)(local_238 + (long)local_244 * 4));
        *(float *)(local_240 + (long)local_244 * 4) = fVar2;
      }
    }
  }
  if (((int)local_1f8[5] == 3) || ((int)local_1f8[5] == 4)) {
    for (local_248 = 0; local_248 < local_224; local_248 = local_248 + 1) {
      local_1e0 = &local_298;
      local_11c = *(int *)((long)local_1f8 + 0x2c);
      local_120 = (int)local_1f8[6];
      local_124 = *(undefined4 *)((long)local_1f8 + 0x34);
      local_250 = *local_1f8 + local_1f8[8] * (long)local_248 * local_1f8[2];
      local_138 = local_1f8[2];
      local_13c = (undefined4)local_1f8[3];
      local_148 = local_1f8[4];
      local_118 = &local_298;
      local_108 = (long)local_11c * (long)local_120 * local_138;
      local_1d8 = &local_298;
      local_1c0 = &local_298;
      local_198 = &local_2e8;
      local_154 = *(int *)((long)local_208 + 0x2c);
      local_158 = (int)local_208[6];
      local_15c = *(undefined4 *)((long)local_208 + 0x34);
      local_2a0 = *local_208 + local_208[8] * (long)local_248 * local_208[2];
      local_170 = local_208[2];
      local_174 = (undefined4)local_208[3];
      local_180 = local_208[4];
      local_150 = &local_2e8;
      local_f8 = (long)local_154 * (long)local_158 * local_170;
      local_188 = &local_2e8;
      local_1b8 = &local_2e8;
      local_260 = 0;
      local_264 = 0;
      local_268 = 0;
      local_26c = 0;
      local_280 = 0;
      local_288 = 0;
      local_290 = 0;
      local_298 = 0;
      local_fc = 0x10;
      local_10c = 0x10;
      local_1a4 = local_248;
      local_1a5 = 1;
      local_1ec = local_248;
      local_1ed = 1;
      local_258 = 0;
      local_270 = 0;
      local_2e8 = 0;
      local_2d8 = 0;
      local_2d0 = 0;
      local_2c0 = 0;
      local_2bc = 0;
      local_2b8 = 0;
      local_2b4 = 0;
      local_2b0 = 0;
      local_2a8 = 0;
      local_2e0 = 0;
      local_168 = local_2a0;
      local_130 = local_250;
      local_c8 = local_1b8;
      local_b8 = local_1c0;
      local_2c8 = local_180;
      local_278 = local_148;
      for (local_2ec = 0; local_2ec < local_220; local_2ec = local_2ec + 1) {
        local_2f4 = *(int *)((long)local_200 + 0x34) + -1;
        piVar1 = std::min<int>(&local_2ec,&local_2f4);
        local_2f0 = *piVar1;
        for (local_2f8 = 0; local_2f8 < local_21c; local_2f8 = local_2f8 + 1) {
          local_300 = (int)local_200[6] + -1;
          piVar1 = std::min<int>(&local_2f8,&local_300);
          local_2fc = *piVar1;
          local_38 = &local_350;
          local_c = *(int *)((long)local_200 + 0x2c);
          local_10 = (undefined4)local_200[6];
          local_18 = *local_200 +
                     (long)*(int *)((long)local_200 + 0x2c) * (long)(int)local_200[6] *
                     (long)local_2f0 * local_200[2];
          local_20 = local_200[2];
          local_24 = (undefined4)local_200[3];
          local_30 = local_200[4];
          local_8 = &local_350;
          local_70 = &local_350;
          local_308 = local_18 + (long)local_c * (long)local_2fc * local_20;
          local_1b0 = &local_350;
          local_44 = local_2f0;
          local_350 = 0;
          local_340 = 0;
          local_338 = 0;
          local_328 = 0;
          local_324 = 0;
          local_320 = 0;
          local_31c = 0;
          local_318 = 0;
          local_310 = 0;
          local_348 = 0;
          local_d8 = local_1b0;
          local_74 = local_2fc;
          local_330 = local_30;
          for (local_354 = 0; local_354 < local_218; local_354 = local_354 + 1) {
            fVar2 = binary_op_sub::operator()
                              (local_211,(float *)(local_250 + (long)local_354 * 4),
                               (float *)(local_308 + (long)local_354 * 4));
            *(float *)(local_2a0 + (long)local_354 * 4) = fVar2;
          }
          local_250 = local_250 + (long)local_218 * 4;
          local_2a0 = local_2a0 + (long)local_218 * 4;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op_broadcast_outer(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;

    if (a.dims == 2)
    {
        // type 14
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const float* ptr = a.row(y);
            const float* ptr1 = b;
            float* outptr = c.row(y);

            for (int x = 0; x < w; x++)
            {
                outptr[x] = op(ptr[x], ptr1[x]);
            }
        }
    }

    if (a.dims == 3 || a.dims == 4)
    {
        // type 15 16 17 18 19
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = c.channel(q);

            for (int z = 0; z < d; z++)
            {
                int z1 = std::min(z, b.d - 1);
                for (int y = 0; y < h; y++)
                {
                    int y1 = std::min(y, b.h - 1);

                    const float* ptr1 = b.depth(z1).row(y1);
                    for (int x = 0; x < w; x++)
                    {
                        outptr[x] = op(ptr[x], ptr1[x]);
                    }

                    ptr += w;
                    outptr += w;
                }
            }
        }
    }

    return 0;
}